

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Server.cc
# Opt level: O0

int __thiscall Server::close(Server *this,int __fd)

{
  int extraout_EAX;
  vector<std::shared_ptr<ClientSocket>,_std::allocator<std::shared_ptr<ClientSocket>_>_> *this_00;
  __normal_iterator<std::shared_ptr<ClientSocket>_*,_std::vector<std::shared_ptr<ClientSocket>,_std::allocator<std::shared_ptr<ClientSocket>_>_>_>
  local_68;
  const_iterator local_60;
  int *local_48;
  shared_ptr<ClientSocket> *local_40;
  __normal_iterator<std::shared_ptr<ClientSocket>_*,_std::vector<std::shared_ptr<ClientSocket>,_std::allocator<std::shared_ptr<ClientSocket>_>_>_>
  local_38;
  __normal_iterator<std::shared_ptr<ClientSocket>_*,_std::vector<std::shared_ptr<ClientSocket>,_std::allocator<std::shared_ptr<ClientSocket>_>_>_>
  local_30;
  const_iterator local_28;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> lock;
  int fileDescriptor_local;
  Server *this_local;
  
  lock._M_device._4_4_ = __fd;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->_staleFileDescriptorsMutex);
  this_00 = &this->_clientSockets;
  local_38._M_current =
       (shared_ptr<ClientSocket> *)
       std::vector<std::shared_ptr<ClientSocket>,_std::allocator<std::shared_ptr<ClientSocket>_>_>::
       begin(this_00);
  local_40 = (shared_ptr<ClientSocket> *)
             std::
             vector<std::shared_ptr<ClientSocket>,_std::allocator<std::shared_ptr<ClientSocket>_>_>
             ::end(this_00);
  local_48 = (int *)((long)&lock._M_device + 4);
  local_30 = std::
             remove_if<__gnu_cxx::__normal_iterator<std::shared_ptr<ClientSocket>*,std::vector<std::shared_ptr<ClientSocket>,std::allocator<std::shared_ptr<ClientSocket>>>>,Server::close(int)::__0>
                       (local_38,(__normal_iterator<std::shared_ptr<ClientSocket>_*,_std::vector<std::shared_ptr<ClientSocket>,_std::allocator<std::shared_ptr<ClientSocket>_>_>_>
                                  )local_40,(anon_class_8_1_486b5c49_for__M_pred)local_48);
  __gnu_cxx::
  __normal_iterator<std::shared_ptr<ClientSocket>const*,std::vector<std::shared_ptr<ClientSocket>,std::allocator<std::shared_ptr<ClientSocket>>>>
  ::__normal_iterator<std::shared_ptr<ClientSocket>*>
            ((__normal_iterator<std::shared_ptr<ClientSocket>const*,std::vector<std::shared_ptr<ClientSocket>,std::allocator<std::shared_ptr<ClientSocket>>>>
              *)&local_28,&local_30);
  local_68._M_current =
       (shared_ptr<ClientSocket> *)
       std::vector<std::shared_ptr<ClientSocket>,_std::allocator<std::shared_ptr<ClientSocket>_>_>::
       end(&this->_clientSockets);
  __gnu_cxx::
  __normal_iterator<std::shared_ptr<ClientSocket>const*,std::vector<std::shared_ptr<ClientSocket>,std::allocator<std::shared_ptr<ClientSocket>>>>
  ::__normal_iterator<std::shared_ptr<ClientSocket>*>
            ((__normal_iterator<std::shared_ptr<ClientSocket>const*,std::vector<std::shared_ptr<ClientSocket>,std::allocator<std::shared_ptr<ClientSocket>>>>
              *)&local_60,&local_68);
  std::vector<std::shared_ptr<ClientSocket>,_std::allocator<std::shared_ptr<ClientSocket>_>_>::erase
            (this_00,local_28,local_60);
  std::vector<int,_std::allocator<int>_>::push_back
            (&this->_staleFileDescriptors,(value_type_conflict *)((long)&lock._M_device + 4));
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return extraout_EAX;
}

Assistant:

void Server::close( int fileDescriptor )
{
  std::lock_guard<std::mutex> lock( _staleFileDescriptorsMutex );

  _clientSockets.erase( std::remove_if( _clientSockets.begin(), _clientSockets.end(),
                                        [&] ( std::shared_ptr<ClientSocket> socket )
                                        {
                                          return socket->fileDescriptor() == fileDescriptor;
                                        } ),
                                        _clientSockets.end() );

  _staleFileDescriptors.push_back( fileDescriptor );
}